

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

void __thiscall LTAircraft::CopyBulkData(LTAircraft *this,LTAPIBulkInfoTexts *pOut,size_t size)

{
  FDKeyTy *pFVar1;
  string *s;
  string *psVar2;
  ulong in_RDX;
  unsigned_long *in_RSI;
  long in_RDI;
  FDDynamicData dyn;
  FDStaticData stat;
  Aircraft *in_stack_fffffffffffff920;
  size_t in_stack_fffffffffffff928;
  unsigned_long *puVar3;
  char *in_stack_fffffffffffff930;
  size_t in_stack_fffffffffffff938;
  char *in_stack_fffffffffffff940;
  allocator<char> *dest;
  allocator<char> *local_6b8;
  allocator<char> *in_stack_fffffffffffff950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  FDDynamicData *in_stack_fffffffffffff968;
  size_t in_stack_fffffffffffff970;
  unsigned_long *m;
  LTFlightData *in_stack_fffffffffffff978;
  LTFlightData *in_stack_fffffffffffff980;
  string local_610 [32];
  string local_5f0 [39];
  allocator<char> local_5c9;
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [112];
  LTChannel *local_1b8;
  string local_1b0 [64];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [56];
  string local_d8 [56];
  string local_a0 [64];
  string local_60 [32];
  string local_40 [40];
  ulong local_18;
  unsigned_long *local_10;
  
  if (0x107 < in_RDX) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    LTFlightData::WaitForSafeCopyStat(in_stack_fffffffffffff978);
    LTFlightData::WaitForSafeCopyDyn
              (in_stack_fffffffffffff980,SUB81((ulong)in_stack_fffffffffffff978 >> 0x38,0));
    pFVar1 = LTFlightData::key(*(LTFlightData **)(in_RDI + 0x348));
    *local_10 = pFVar1->num;
    std::__cxx11::string::string(local_248,local_1b0);
    strAtMost((string *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    strncpy_s(in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930,
              in_stack_fffffffffffff928);
    std::__cxx11::string::~string(local_228);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::string(local_288,local_170);
    strAtMost((string *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    strncpy_s(in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930,
              in_stack_fffffffffffff928);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::string::~string(local_288);
    std::__cxx11::string::string(local_2c8,(string *)(*(long *)(in_RDI + 0x358) + 0x60));
    strAtMost((string *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    strncpy_s(in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930,
              in_stack_fffffffffffff928);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::string::~string(local_2c8);
    std::__cxx11::string::string(local_308,(string *)(*(long *)(in_RDI + 0x358) + 0x80));
    strAtMost((string *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    strncpy_s(in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930,
              in_stack_fffffffffffff928);
    std::__cxx11::string::~string(local_2e8);
    std::__cxx11::string::~string(local_308);
    std::__cxx11::string::string(local_348,local_40);
    strAtMost((string *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    strncpy_s(in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930,
              in_stack_fffffffffffff928);
    std::__cxx11::string::~string(local_328);
    std::__cxx11::string::~string(local_348);
    std::__cxx11::string::string(local_388,local_150);
    strAtMost((string *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    strncpy_s(in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930,
              in_stack_fffffffffffff928);
    std::__cxx11::string::~string(local_368);
    std::__cxx11::string::~string(local_388);
    std::__cxx11::string::string(local_3c8,local_130);
    strAtMost((string *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    strncpy_s(in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930,
              in_stack_fffffffffffff928);
    std::__cxx11::string::~string(local_3a8);
    std::__cxx11::string::~string(local_3c8);
    std::__cxx11::string::string(local_408,local_110);
    strAtMost((string *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    strncpy_s(in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930,
              in_stack_fffffffffffff928);
    std::__cxx11::string::~string(local_3e8);
    std::__cxx11::string::~string(local_408);
    std::__cxx11::string::string(local_448,local_60);
    strAtMost((string *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    strncpy_s(in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930,
              in_stack_fffffffffffff928);
    std::__cxx11::string::~string(local_428);
    std::__cxx11::string::~string(local_448);
    std::__cxx11::string::string(local_488,local_d8);
    strAtMost((string *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    strncpy_s(in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930,
              in_stack_fffffffffffff928);
    std::__cxx11::string::~string(local_468);
    std::__cxx11::string::~string(local_488);
    LTFlightData::FDDynamicData::GetSquawk_abi_cxx11_(in_stack_fffffffffffff968);
    strAtMost((string *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    strncpy_s(in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930,
              in_stack_fffffffffffff928);
    std::__cxx11::string::~string(local_4a8);
    std::__cxx11::string::~string(local_4c8);
    std::__cxx11::string::string(local_508,local_a0);
    strAtMost((string *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    strncpy_s(in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930,
              in_stack_fffffffffffff928);
    std::__cxx11::string::~string(local_4e8);
    std::__cxx11::string::~string(local_508);
    m = local_10 + 0x1c;
    s = LTFlightData::FDStaticData::origin_abi_cxx11_((FDStaticData *)in_stack_fffffffffffff920);
    std::__cxx11::string::string(local_548,(string *)s);
    strAtMost(s,(size_t)m);
    std::__cxx11::string::c_str();
    strncpy_s(in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930,
              in_stack_fffffffffffff928);
    std::__cxx11::string::~string(local_528);
    std::__cxx11::string::~string(local_548);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_10 + 0x1d)
    ;
    psVar2 = LTFlightData::FDStaticData::dest_abi_cxx11_((FDStaticData *)in_stack_fffffffffffff920);
    std::__cxx11::string::string(local_588,(string *)psVar2);
    strAtMost(s,(size_t)m);
    std::__cxx11::string::c_str();
    strncpy_s(in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930,
              in_stack_fffffffffffff928);
    std::__cxx11::string::~string(local_568);
    std::__cxx11::string::~string(local_588);
    puVar3 = local_10 + 0x1e;
    if (local_1b8 == (LTChannel *)0x0) {
      local_6b8 = (allocator<char> *)0x3bfb8a;
    }
    else {
      local_6b8 = (allocator<char> *)LTChannel::ChName(local_1b8);
      in_stack_fffffffffffff950 = local_6b8;
    }
    dest = &local_5c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)puVar3,in_stack_fffffffffffff950);
    strAtMost(s,(size_t)m);
    std::__cxx11::string::c_str();
    strncpy_s((char *)dest,(size_t)local_6b8,in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    std::__cxx11::string::~string(local_5a8);
    std::__cxx11::string::~string(local_5c8);
    std::allocator<char>::~allocator(&local_5c9);
    if (local_18 < 0x130) {
      if (0x11f < local_18) {
        in_stack_fffffffffffff920 =
             (Aircraft *)XPMP2::Aircraft::GetModelName_abi_cxx11_(in_stack_fffffffffffff920);
        std::__cxx11::string::c_str();
        strncpy_s((char *)dest,(size_t)local_6b8,in_stack_fffffffffffff930,in_stack_fffffffffffff928
                 );
      }
    }
    else {
      puVar3 = local_10 + 0x21;
      psVar2 = XPMP2::Aircraft::GetModelName_abi_cxx11_(in_stack_fffffffffffff920);
      std::__cxx11::string::string(local_610,(string *)psVar2);
      strAtMost(s,(size_t)m);
      std::__cxx11::string::c_str();
      strncpy_s((char *)dest,(size_t)local_6b8,(char *)psVar2,(size_t)puVar3);
      std::__cxx11::string::~string(local_5f0);
      std::__cxx11::string::~string(local_610);
    }
    LTFlightData::FDStaticData::~FDStaticData((FDStaticData *)in_stack_fffffffffffff920);
  }
  return;
}

Assistant:

void LTAircraft::CopyBulkData (LTAPIAircraft::LTAPIBulkInfoTexts* pOut,
                               size_t size) const
{
    // If size isn't enough for original structure we bail:
    if (size < LTAPIBulkInfoTexts_v120)
        return;
    
    // Fill the output buffer one by one
    const LTFlightData::FDStaticData stat = fd.WaitForSafeCopyStat();
    const LTFlightData::FDDynamicData dyn = fd.WaitForSafeCopyDyn();
    pOut->keyNum = fd.key().num;
    STRCPY_ATMOST(pOut->registration,   stat.reg);
    // aircraft model/operator
    STRCPY_ATMOST(pOut->modelIcao,      stat.acTypeIcao);
    STRCPY_ATMOST(pOut->acClass,        pDoc8643->classification);
    STRCPY_ATMOST(pOut->wtc,            pDoc8643->wtc);
    STRCPY_ATMOST(pOut->opIcao,         stat.opIcao);
    STRCPY_ATMOST(pOut->man,            stat.man);
    STRCPY_ATMOST(pOut->model,          stat.mdl);
    STRCPY_ATMOST(pOut->catDescr,       stat.catDescr);
    STRCPY_ATMOST(pOut->op,             stat.op);
    // flight data
    STRCPY_ATMOST(pOut->callSign,       stat.call);
    STRCPY_ATMOST(pOut->squawk,         dyn.GetSquawk());
    STRCPY_ATMOST(pOut->flightNumber,   stat.flight);
    STRCPY_ATMOST(pOut->origin,         stat.origin());
    STRCPY_ATMOST(pOut->destination,    stat.dest());
    STRCPY_ATMOST(pOut->trackedBy,      dyn.pChannel ? dyn.pChannel->ChName() : "-");
    
    // v2.40 additions (cslModel field extended to 40 chars)
    if (size >= LTAPIBulkInfoTexts_v240) {
        STRCPY_ATMOST(pOut->cslModel, GetModelName());
    }
    // v1.22 additions (cslModel field had 24 chars only)
    else if (size >= LTAPIBulkInfoTexts_v122) {
        strncpy_s(pOut->cslModel, 24, GetModelName().c_str(), 23);
    }
}